

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

string * Image::suffix(string *filename)

{
  char *in_RSI;
  string *in_RDI;
  int dotpos;
  allocator local_15;
  int local_14;
  char *local_10;
  
  local_10 = in_RSI;
  local_14 = std::__cxx11::string::rfind(in_RSI,0x1be7f3);
  if (local_14 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  }
  return in_RDI;
}

Assistant:

static std::string suffix(const std::string& filename)
	{
		int dotpos = filename.rfind(".");
		if (dotpos == std::string::npos) {
			return "";
		}
		return filename.substr(dotpos+1);
	}